

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

Reference __thiscall
mp::BasicExprFactory<std::allocator<char>_>::MakeReference
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int index)

{
  Impl *pIVar1;
  Reference RVar2;
  int in_EDX;
  BasicExprFactory<std::allocator<char>_> *unaff_retaddr;
  Impl *impl;
  Impl *in_stack_ffffffffffffffd8;
  undefined8 in_stack_fffffffffffffff8;
  
  pIVar1 = Allocate<mp::Reference>
                     (unaff_retaddr,(Kind)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                      (int)in_stack_fffffffffffffff8);
  pIVar1->index = in_EDX;
  RVar2 = internal::ExprBase::Create<mp::Reference>(in_stack_ffffffffffffffd8);
  return (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)
         RVar2.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
}

Assistant:

Reference MakeReference(expr::Kind kind, int index) {
    typename Reference::Impl *impl = Allocate<Reference>(kind);
    impl->index = index;
    return Expr::Create<Reference>(impl);
  }